

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O3

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,ReturnStmt *node)

{
  Expr *pEVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"return ",7);
  pEVar1 = (node->m_expr)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  (*(pEVar1->super_Stmt)._vptr_Stmt[2])(pEVar1,this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void PrettyPrinter::visit(AST::ReturnStmt *node) {
    std::cout << "return ";
    node->m_expr->accept(this);
    std::cout << ";" << std::endl;
}